

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O3

void ApplyAlphaMultiply_SSE2(uint8_t *rgba,int alpha_first,int w,int h,int stride)

{
  bool bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint8_t *puVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  uint8_t *puVar32;
  long lVar33;
  undefined1 auVar34 [16];
  ushort uVar35;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 in_XMM6 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar46;
  undefined1 auVar39 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  auVar27 = _DAT_001b2a90;
  auVar26 = _DAT_001b2a80;
  auVar25 = _DAT_001b2a50;
  if (0 < h) {
    puVar32 = rgba + (ulong)(alpha_first == 0) * 3;
    puVar28 = rgba + (alpha_first != 0);
    do {
      if (alpha_first == 0) {
        if (w < 4) goto LAB_0011a7b8;
        uVar30 = 0;
        do {
          auVar38 = *(undefined1 (*) [16])(rgba + uVar30 * 4);
          auVar3[0xd] = 0;
          auVar3._0_13_ = auVar38._0_13_;
          auVar3[0xe] = auVar38[7];
          auVar5[0xc] = auVar38[6];
          auVar5._0_12_ = auVar38._0_12_;
          auVar5._13_2_ = auVar3._13_2_;
          auVar7[0xb] = 0;
          auVar7._0_11_ = auVar38._0_11_;
          auVar7._12_3_ = auVar5._12_3_;
          auVar9[10] = auVar38[5];
          auVar9._0_10_ = auVar38._0_10_;
          auVar9._11_4_ = auVar7._11_4_;
          auVar11[9] = 0;
          auVar11._0_9_ = auVar38._0_9_;
          auVar11._10_5_ = auVar9._10_5_;
          auVar13[8] = auVar38[4];
          auVar13._0_8_ = auVar38._0_8_;
          auVar13._9_6_ = auVar11._9_6_;
          auVar18._7_8_ = 0;
          auVar18._0_7_ = auVar13._8_7_;
          Var15 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar38[3]);
          auVar23._9_6_ = 0;
          auVar23._0_9_ = Var15;
          auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
          auVar19[0] = auVar38[2];
          auVar24._11_4_ = 0;
          auVar24._0_11_ = auVar19;
          auVar20._1_12_ = SUB1512(auVar24 << 0x20,3);
          auVar20[0] = auVar38[1];
          auVar47._0_2_ = CONCAT11(0,auVar38[0]);
          auVar47._2_13_ = auVar20;
          auVar47[0xf] = 0;
          auVar36._0_2_ = CONCAT11(0,auVar38[8]);
          auVar36[2] = auVar38[9];
          auVar36[3] = 0;
          auVar36[4] = auVar38[10];
          auVar36[5] = 0;
          auVar36[6] = auVar38[0xb];
          auVar36[7] = 0;
          auVar36[8] = auVar38[0xc];
          auVar36[9] = 0;
          auVar36[10] = auVar38[0xd];
          auVar36[0xb] = 0;
          auVar36[0xc] = auVar38[0xe];
          auVar36[0xd] = 0;
          auVar36[0xe] = auVar38[0xf];
          auVar36[0xf] = 0;
          auVar39 = pshuflw(in_XMM6,auVar47,0xbf);
          auVar39 = pshufhw(auVar39,auVar39,0xbf);
          auVar39 = auVar39 | auVar25;
          auVar49 = pshuflw(in_XMM7,auVar36,0xbf);
          auVar50 = pshufhw(auVar49,auVar49,0xbf);
          auVar50 = auVar50 | auVar25;
          auVar49._0_2_ = auVar39._0_2_ * auVar47._0_2_;
          auVar49._2_2_ = auVar39._2_2_ * auVar20._0_2_;
          auVar49._4_2_ = auVar39._4_2_ * auVar19._0_2_;
          auVar49._6_2_ = auVar39._6_2_ * (short)Var15;
          auVar49._8_2_ = auVar39._8_2_ * auVar13._8_2_;
          auVar49._10_2_ = auVar39._10_2_ * auVar9._10_2_;
          auVar49._12_2_ = auVar39._12_2_ * auVar5._12_2_;
          auVar49._14_2_ = auVar39._14_2_ * (auVar3._13_2_ >> 8);
          auVar39._0_2_ = auVar50._0_2_ * auVar36._0_2_;
          auVar39._2_2_ = auVar50._2_2_ * (ushort)auVar38[9];
          auVar39._4_2_ = auVar50._4_2_ * (ushort)auVar38[10];
          auVar39._6_2_ = auVar50._6_2_ * (ushort)auVar38[0xb];
          auVar39._8_2_ = auVar50._8_2_ * (ushort)auVar38[0xc];
          auVar39._10_2_ = auVar50._10_2_ * (ushort)auVar38[0xd];
          auVar39._12_2_ = auVar50._12_2_ * (ushort)auVar38[0xe];
          auVar39._14_2_ = auVar50._14_2_ * (ushort)auVar38[0xf];
          auVar38 = pmulhuw(auVar49,auVar26);
          auVar36 = pmulhuw(auVar39,auVar26);
          uVar35 = auVar38._0_2_ >> 7;
          uVar40 = auVar38._2_2_ >> 7;
          uVar41 = auVar38._4_2_ >> 7;
          uVar42 = auVar38._6_2_ >> 7;
          uVar43 = auVar38._8_2_ >> 7;
          uVar44 = auVar38._10_2_ >> 7;
          uVar45 = auVar38._12_2_ >> 7;
          uVar46 = auVar38._14_2_ >> 7;
          in_XMM7._0_2_ = auVar36._0_2_ >> 7;
          in_XMM7._2_2_ = auVar36._2_2_ >> 7;
          in_XMM7._4_2_ = auVar36._4_2_ >> 7;
          in_XMM7._6_2_ = auVar36._6_2_ >> 7;
          in_XMM7._8_2_ = auVar36._8_2_ >> 7;
          in_XMM7._10_2_ = auVar36._10_2_ >> 7;
          in_XMM7._12_2_ = auVar36._12_2_ >> 7;
          in_XMM7._14_2_ = auVar36._14_2_ >> 7;
          in_XMM6[1] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
          in_XMM6[0] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
          in_XMM6[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          in_XMM6[3] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
          in_XMM6[4] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
          in_XMM6[5] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
          in_XMM6[6] = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
          in_XMM6[7] = (uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46);
          in_XMM6[8] = (in_XMM7._0_2_ != 0) * (in_XMM7._0_2_ < 0x100) * (char)in_XMM7._0_2_ -
                       (0xff < in_XMM7._0_2_);
          in_XMM6[9] = (in_XMM7._2_2_ != 0) * (in_XMM7._2_2_ < 0x100) * (char)in_XMM7._2_2_ -
                       (0xff < in_XMM7._2_2_);
          in_XMM6[10] = (in_XMM7._4_2_ != 0) * (in_XMM7._4_2_ < 0x100) * (char)in_XMM7._4_2_ -
                        (0xff < in_XMM7._4_2_);
          in_XMM6[0xb] = (in_XMM7._6_2_ != 0) * (in_XMM7._6_2_ < 0x100) * (char)in_XMM7._6_2_ -
                         (0xff < in_XMM7._6_2_);
          in_XMM6[0xc] = (in_XMM7._8_2_ != 0) * (in_XMM7._8_2_ < 0x100) * (char)in_XMM7._8_2_ -
                         (0xff < in_XMM7._8_2_);
          in_XMM6[0xd] = (in_XMM7._10_2_ != 0) * (in_XMM7._10_2_ < 0x100) * (char)in_XMM7._10_2_ -
                         (0xff < in_XMM7._10_2_);
          in_XMM6[0xe] = (in_XMM7._12_2_ != 0) * (in_XMM7._12_2_ < 0x100) * (char)in_XMM7._12_2_ -
                         (0xff < in_XMM7._12_2_);
          in_XMM6[0xf] = (in_XMM7._14_2_ != 0) * (in_XMM7._14_2_ < 0x100) * (char)in_XMM7._14_2_ -
                         (0xff < in_XMM7._14_2_);
          *(undefined1 (*) [16])(rgba + uVar30 * 4) = in_XMM6;
          uVar29 = uVar30 + 4;
          lVar33 = uVar30 + 8;
          uVar30 = uVar29;
        } while (lVar33 <= w);
      }
      else if (w < 4) {
LAB_0011a7b8:
        uVar29 = 0;
      }
      else {
        uVar30 = 0;
        do {
          auVar38 = *(undefined1 (*) [16])(rgba + uVar30 * 4);
          auVar2[0xd] = 0;
          auVar2._0_13_ = auVar38._0_13_;
          auVar2[0xe] = auVar38[7];
          auVar4[0xc] = auVar38[6];
          auVar4._0_12_ = auVar38._0_12_;
          auVar4._13_2_ = auVar2._13_2_;
          auVar6[0xb] = 0;
          auVar6._0_11_ = auVar38._0_11_;
          auVar6._12_3_ = auVar4._12_3_;
          auVar8[10] = auVar38[5];
          auVar8._0_10_ = auVar38._0_10_;
          auVar8._11_4_ = auVar6._11_4_;
          auVar10[9] = 0;
          auVar10._0_9_ = auVar38._0_9_;
          auVar10._10_5_ = auVar8._10_5_;
          auVar12[8] = auVar38[4];
          auVar12._0_8_ = auVar38._0_8_;
          auVar12._9_6_ = auVar10._9_6_;
          auVar14._7_8_ = 0;
          auVar14._0_7_ = auVar12._8_7_;
          Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),auVar38[3]);
          auVar21._9_6_ = 0;
          auVar21._0_9_ = Var15;
          auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
          auVar16[0] = auVar38[2];
          auVar22._11_4_ = 0;
          auVar22._0_11_ = auVar16;
          auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
          auVar17[0] = auVar38[1];
          auVar34._0_2_ = CONCAT11(0,auVar38[0]);
          auVar34._2_13_ = auVar17;
          auVar34[0xf] = 0;
          auVar50._0_2_ = CONCAT11(0,auVar38[8]);
          auVar50[2] = auVar38[9];
          auVar50[3] = 0;
          auVar50[4] = auVar38[10];
          auVar50[5] = 0;
          auVar50[6] = auVar38[0xb];
          auVar50[7] = 0;
          auVar50[8] = auVar38[0xc];
          auVar50[9] = 0;
          auVar50[10] = auVar38[0xd];
          auVar50[0xb] = 0;
          auVar50[0xc] = auVar38[0xe];
          auVar50[0xd] = 0;
          auVar50[0xe] = auVar38[0xf];
          auVar50[0xf] = 0;
          auVar36 = pshuflw(in_XMM6,auVar34,1);
          auVar36 = pshufhw(auVar36,auVar36,1);
          auVar36 = auVar36 | auVar27;
          auVar47 = pshuflw(in_XMM7,auVar50,1);
          auVar47 = pshufhw(auVar47,auVar47,1);
          auVar47 = auVar47 | auVar27;
          auVar37._0_2_ = auVar36._0_2_ * auVar34._0_2_;
          auVar37._2_2_ = auVar36._2_2_ * auVar17._0_2_;
          auVar37._4_2_ = auVar36._4_2_ * auVar16._0_2_;
          auVar37._6_2_ = auVar36._6_2_ * (short)Var15;
          auVar37._8_2_ = auVar36._8_2_ * auVar12._8_2_;
          auVar37._10_2_ = auVar36._10_2_ * auVar8._10_2_;
          auVar37._12_2_ = auVar36._12_2_ * auVar4._12_2_;
          auVar37._14_2_ = auVar36._14_2_ * (auVar2._13_2_ >> 8);
          auVar48._0_2_ = auVar47._0_2_ * auVar50._0_2_;
          auVar48._2_2_ = auVar47._2_2_ * (ushort)auVar38[9];
          auVar48._4_2_ = auVar47._4_2_ * (ushort)auVar38[10];
          auVar48._6_2_ = auVar47._6_2_ * (ushort)auVar38[0xb];
          auVar48._8_2_ = auVar47._8_2_ * (ushort)auVar38[0xc];
          auVar48._10_2_ = auVar47._10_2_ * (ushort)auVar38[0xd];
          auVar48._12_2_ = auVar47._12_2_ * (ushort)auVar38[0xe];
          auVar48._14_2_ = auVar47._14_2_ * (ushort)auVar38[0xf];
          auVar38 = pmulhuw(auVar37,auVar26);
          auVar36 = pmulhuw(auVar48,auVar26);
          uVar35 = auVar38._0_2_ >> 7;
          uVar40 = auVar38._2_2_ >> 7;
          uVar41 = auVar38._4_2_ >> 7;
          uVar42 = auVar38._6_2_ >> 7;
          uVar43 = auVar38._8_2_ >> 7;
          uVar44 = auVar38._10_2_ >> 7;
          uVar45 = auVar38._12_2_ >> 7;
          uVar46 = auVar38._14_2_ >> 7;
          in_XMM7._0_2_ = auVar36._0_2_ >> 7;
          in_XMM7._2_2_ = auVar36._2_2_ >> 7;
          in_XMM7._4_2_ = auVar36._4_2_ >> 7;
          in_XMM7._6_2_ = auVar36._6_2_ >> 7;
          in_XMM7._8_2_ = auVar36._8_2_ >> 7;
          in_XMM7._10_2_ = auVar36._10_2_ >> 7;
          in_XMM7._12_2_ = auVar36._12_2_ >> 7;
          in_XMM7._14_2_ = auVar36._14_2_ >> 7;
          in_XMM6[1] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
          in_XMM6[0] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
          in_XMM6[2] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          in_XMM6[3] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
          in_XMM6[4] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
          in_XMM6[5] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
          in_XMM6[6] = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
          in_XMM6[7] = (uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46);
          in_XMM6[8] = (in_XMM7._0_2_ != 0) * (in_XMM7._0_2_ < 0x100) * (char)in_XMM7._0_2_ -
                       (0xff < in_XMM7._0_2_);
          in_XMM6[9] = (in_XMM7._2_2_ != 0) * (in_XMM7._2_2_ < 0x100) * (char)in_XMM7._2_2_ -
                       (0xff < in_XMM7._2_2_);
          in_XMM6[10] = (in_XMM7._4_2_ != 0) * (in_XMM7._4_2_ < 0x100) * (char)in_XMM7._4_2_ -
                        (0xff < in_XMM7._4_2_);
          in_XMM6[0xb] = (in_XMM7._6_2_ != 0) * (in_XMM7._6_2_ < 0x100) * (char)in_XMM7._6_2_ -
                         (0xff < in_XMM7._6_2_);
          in_XMM6[0xc] = (in_XMM7._8_2_ != 0) * (in_XMM7._8_2_ < 0x100) * (char)in_XMM7._8_2_ -
                         (0xff < in_XMM7._8_2_);
          in_XMM6[0xd] = (in_XMM7._10_2_ != 0) * (in_XMM7._10_2_ < 0x100) * (char)in_XMM7._10_2_ -
                         (0xff < in_XMM7._10_2_);
          in_XMM6[0xe] = (in_XMM7._12_2_ != 0) * (in_XMM7._12_2_ < 0x100) * (char)in_XMM7._12_2_ -
                         (0xff < in_XMM7._12_2_);
          in_XMM6[0xf] = (in_XMM7._14_2_ != 0) * (in_XMM7._14_2_ < 0x100) * (char)in_XMM7._14_2_ -
                         (0xff < in_XMM7._14_2_);
          *(undefined1 (*) [16])(rgba + uVar30 * 4) = in_XMM6;
          uVar29 = uVar30 + 4;
          lVar33 = uVar30 + 8;
          uVar30 = uVar29;
        } while (lVar33 <= w);
      }
      if ((int)uVar29 < w) {
        uVar29 = uVar29 & 0xffffffff;
        do {
          if (puVar32[uVar29 * 4] != 0xff) {
            iVar31 = (uint)puVar32[uVar29 * 4] * 0x8081;
            puVar28[uVar29 * 4] = (uint8_t)((uint)puVar28[uVar29 * 4] * iVar31 >> 0x17);
            puVar28[uVar29 * 4 + 1] = (uint8_t)((uint)puVar28[uVar29 * 4 + 1] * iVar31 >> 0x17);
            puVar28[uVar29 * 4 + 2] = (uint8_t)((uint)puVar28[uVar29 * 4 + 2] * iVar31 >> 0x17);
          }
          uVar29 = uVar29 + 1;
        } while ((uint)w != uVar29);
      }
      rgba = rgba + stride;
      puVar32 = puVar32 + stride;
      puVar28 = puVar28 + stride;
      bVar1 = 1 < h;
      h = h + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void ApplyAlphaMultiply_SSE2(uint8_t* rgba, int alpha_first,
                                    int w, int h, int stride) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i kMult = _mm_set1_epi16((short)0x8081);
  const __m128i kMask = _mm_set_epi16(0, 0xff, 0xff, 0, 0, 0xff, 0xff, 0);
  const int kSpan = 4;
  while (h-- > 0) {
    uint32_t* const rgbx = (uint32_t*)rgba;
    int i;
    if (!alpha_first) {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(2, 3, 3, 3));
      }
    } else {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(0, 0, 0, 1));
      }
    }
    // Finish with left-overs.
    for (; i < w; ++i) {
      uint8_t* const rgb = rgba + (alpha_first ? 1 : 0);
      const uint8_t* const alpha = rgba + (alpha_first ? 0 : 3);
      const uint32_t a = alpha[4 * i];
      if (a != 0xff) {
        const uint32_t mult = MULTIPLIER(a);
        rgb[4 * i + 0] = PREMULTIPLY(rgb[4 * i + 0], mult);
        rgb[4 * i + 1] = PREMULTIPLY(rgb[4 * i + 1], mult);
        rgb[4 * i + 2] = PREMULTIPLY(rgb[4 * i + 2], mult);
      }
    }
    rgba += stride;
  }
}